

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

string * __thiscall
fasttext::Args::modelToString_abi_cxx11_(string *__return_storage_ptr__,Args *this,model_name mn)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if (mn == sup) {
    pcVar2 = "sup";
    paVar1 = &local_b;
  }
  else if (mn == sg) {
    pcVar2 = "sg";
    paVar1 = &local_a;
  }
  else if (mn == cbow) {
    pcVar2 = "cbow";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "Unknown model name!";
    paVar1 = &local_c;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Args::modelToString(model_name mn) const {
  switch (mn) {
    case model_name::cbow:
      return "cbow";
    case model_name::sg:
      return "sg";
    case model_name::sup:
      return "sup";
  }
  return "Unknown model name!"; // should never happen
}